

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * json_loadf(FILE *input,size_t flags,json_error_t *error)

{
  int iVar1;
  json_t *result;
  char *source;
  lex_t lex;
  json_error_t *error_local;
  size_t flags_local;
  FILE *input_local;
  
  if (input == _stdin) {
    result = (json_t *)anon_var_dwarf_5329;
  }
  else {
    result = (json_t *)anon_var_dwarf_5340;
  }
  lex.value.string.len = (size_t)error;
  jsonp_error_init(error,(char *)result);
  if (input == (FILE *)0x0) {
    error_set((json_error_t *)lex.value.string.len,(lex_t *)0x0,json_error_invalid_argument,
              "wrong arguments");
    input_local = (FILE *)0x0;
  }
  else {
    iVar1 = lex_init((lex_t *)&source,fgetc,flags,input);
    if (iVar1 == 0) {
      input_local = (FILE *)parse_json((lex_t *)&source,flags,(json_error_t *)lex.value.string.len);
      lex_close((lex_t *)&source);
    }
    else {
      input_local = (FILE *)0x0;
    }
  }
  return (json_t *)input_local;
}

Assistant:

json_t *json_loadf(FILE *input, size_t flags, json_error_t *error) {
    lex_t lex;
    const char *source;
    json_t *result;

    if (input == stdin)
        source = "<stdin>";
    else
        source = "<stream>";

    jsonp_error_init(error, source);

    if (input == NULL) {
        error_set(error, NULL, json_error_invalid_argument, "wrong arguments");
        return NULL;
    }

    if (lex_init(&lex, (get_func) fgetc, flags, input))
        return NULL;

    result = parse_json(&lex, flags, error);

    lex_close(&lex);
    return result;
}